

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall SuiteSessionTests::MsgWithBadType::MsgWithBadType(MsgWithBadType *this)

{
  allocator<char> local_91;
  STRING local_90;
  FieldBase local_70;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"*",&local_91);
  FIX::MsgType::MsgType((MsgType *)&local_70,&local_90);
  FIX42::Message::Message(&this->super_Message,(MsgType *)&local_70);
  FIX::FieldBase::~FieldBase(&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  *(undefined ***)&this->super_Message = &PTR__Message_00325450;
  return;
}

Assistant:

MsgWithBadType() : FIX42::Message( MsgType( "*" ) ) {}